

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

VariableDeclStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::VariableDeclStatement,slang::ast::VariableSymbol_const&,slang::SourceRange&>
          (BumpAllocator *this,VariableSymbol *args,SourceRange *args_1)

{
  SourceRange sourceRange;
  VariableDeclStatement *pVVar1;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pVVar1 = (VariableDeclStatement *)
           allocate((BumpAllocator *)in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  sourceRange.endLoc = in_RSI;
  sourceRange.startLoc = in_RDX;
  ast::VariableDeclStatement::VariableDeclStatement
            (*(VariableDeclStatement **)((long)in_RDX + 8),*(VariableSymbol **)in_RDX,sourceRange);
  return pVVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }